

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

int64_t av1_max_level_bitrate(BITSTREAM_PROFILE seq_profile,int seq_level_idx,int seq_tier)

{
  int iVar1;
  int64_t bitrate;
  int seq_tier_local;
  int seq_level_idx_local;
  BITSTREAM_PROFILE seq_profile_local;
  
  if (seq_tier == 0) {
    iVar1 = main_kbps[seq_level_idx] * bitrate_profile_factor[seq_profile];
  }
  else {
    iVar1 = high_kbps[seq_level_idx] * bitrate_profile_factor[seq_profile];
  }
  bitrate = (int64_t)iVar1;
  return bitrate * 1000;
}

Assistant:

int64_t av1_max_level_bitrate(BITSTREAM_PROFILE seq_profile, int seq_level_idx,
                              int seq_tier) {
  int64_t bitrate;

  if (seq_tier) {
    bitrate = high_kbps[seq_level_idx] * bitrate_profile_factor[seq_profile];
  } else {
    bitrate = main_kbps[seq_level_idx] * bitrate_profile_factor[seq_profile];
  }

  return bitrate * 1000;
}